

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  byte *pbVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uchar *puVar8;
  void *__ptr;
  long lVar9;
  ulong uVar10;
  uchar *out_00;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  size_t bytewidth;
  LodePNGColorMode *info;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  uint local_28c;
  ulong local_280;
  ulong local_250;
  uint local_238 [8];
  uint local_218 [8];
  uint local_1f8 [8];
  uint local_1d8 [8];
  size_t local_1b8 [8];
  size_t local_178 [7];
  size_t local_140;
  size_t local_138 [8];
  size_t local_f8 [7];
  size_t local_c0;
  size_t local_b8 [8];
  size_t local_78 [9];
  
  info = (LodePNGColorMode *)(ulong)(info_png->color).colortype;
  uVar7 = (info_png->color).bitdepth;
  iVar4 = 0;
  if (info < (LodePNGColorMode *)0x7) {
    iVar4 = *(int *)(&DAT_00115b24 + (long)info * 4);
  }
  uVar5 = iVar4 * uVar7;
  if (info_png->interlace_method == 0) {
    uVar12 = uVar5 * w;
    uVar16 = (uVar12 + 7 >> 3) * h;
    uVar11 = uVar16 + h;
    *outsize = (ulong)uVar11;
    puVar8 = (uchar *)malloc((ulong)uVar11);
    *out = puVar8;
    uVar6 = (uint)CONCAT71((int7)((ulong)out >> 8),puVar8 == (uchar *)0x0);
    if (uVar11 == 0 || puVar8 != (uchar *)0x0) {
      if ((uVar5 < 8) && (uVar5 = uVar12 + 7 & 0xfffffff8, uVar12 != uVar5)) {
        out_00 = (uchar *)malloc((ulong)uVar16);
        if (out_00 != (uchar *)0x0) {
          addPaddingBits(out_00,in,(ulong)uVar5,(ulong)uVar12,h);
          filter(puVar8,out_00,w,h,info,(LodePNGEncoderSettings *)(ulong)uVar7);
        }
        free(out_00);
        return extraout_EAX_00;
      }
      uVar6 = filter(puVar8,in,w,h,info,(LodePNGEncoderSettings *)(ulong)uVar7);
    }
  }
  else {
    Adam7_getpassvalues(local_218,local_238,local_178,local_1b8,local_f8,w,h,uVar5);
    *outsize = local_140;
    puVar8 = (uchar *)malloc(local_140);
    *out = puVar8;
    __ptr = malloc(local_c0);
    if ((puVar8 != (uchar *)0x0) && (local_c0 == 0 || __ptr != (void *)0x0)) {
      Adam7_getpassvalues(local_1d8,local_1f8,local_78,local_b8,local_138,w,h,uVar5);
      if (uVar5 < 8) {
        lVar9 = 0;
        do {
          uVar7 = local_1f8[lVar9];
          if (uVar7 != 0) {
            uVar6 = local_1d8[lVar9];
            local_28c = 0;
            do {
              if ((ulong)uVar6 != 0) {
                uVar11 = ADAM7_DY[lVar9];
                uVar12 = ADAM7_IY[lVar9];
                uVar16 = ADAM7_DX[lVar9];
                sVar3 = local_138[lVar9];
                uVar2 = ADAM7_IX[lVar9];
                uVar14 = 0;
                do {
                  if (uVar5 != 0) {
                    uVar13 = (ulong)((uVar6 * local_28c + (int)uVar14) * uVar5) + sVar3 * 8;
                    uVar10 = (ulong)((uVar16 * (int)uVar14 +
                                     (uVar11 * local_28c + uVar12) * w + uVar2) * uVar5);
                    uVar17 = uVar5;
                    do {
                      bVar15 = '\x01' << (~(byte)uVar13 & 7);
                      if ((in[uVar10 >> 3] >> (~(byte)uVar10 & 7) & 1) == 0) {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 & ~bVar15;
                      }
                      else {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 | bVar15;
                      }
                      uVar13 = uVar13 + 1;
                      uVar10 = uVar10 + 1;
                      uVar17 = uVar17 - 1;
                    } while (uVar17 != 0);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar6);
              }
              local_28c = local_28c + 1;
            } while (local_28c != uVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      else {
        uVar14 = (ulong)(uVar5 >> 3);
        lVar9 = 0;
        do {
          uVar7 = local_1f8[lVar9];
          if ((ulong)uVar7 != 0) {
            uVar10 = (ulong)local_1d8[lVar9];
            local_250 = 0;
            local_280 = 0;
            do {
              if (uVar10 != 0) {
                uVar6 = ADAM7_DX[lVar9];
                sVar3 = local_138[lVar9];
                uVar11 = (ADAM7_DY[lVar9] * (int)local_280 + ADAM7_IY[lVar9]) * w + ADAM7_IX[lVar9];
                uVar13 = local_250;
                uVar18 = uVar10;
                do {
                  memcpy((void *)((long)__ptr + (uVar13 & 0xffffffff) * uVar14 + sVar3),
                         in + uVar11 * uVar14,uVar14);
                  uVar11 = uVar11 + uVar6;
                  uVar13 = uVar13 + 1;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              local_280 = local_280 + 1;
              local_250 = local_250 + uVar10;
            } while (local_280 != uVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      lVar9 = 0;
      do {
        if (uVar5 < 8) {
          puVar8 = (uchar *)malloc(*(long *)((long)local_1b8 + lVar9 * 2 + 8) -
                                   *(long *)((long)local_1b8 + lVar9 * 2));
          if (puVar8 == (uchar *)0x0) break;
          uVar7 = *(uint *)((long)local_218 + lVar9);
          uVar11 = uVar7 * uVar5;
          uVar6 = *(uint *)((long)local_238 + lVar9);
          addPaddingBits(puVar8,(uchar *)(*(long *)((long)local_f8 + lVar9 * 2) + (long)__ptr),
                         (ulong)(uVar11 + 7 & 0xfffffff8),(ulong)uVar11,uVar6);
          uVar7 = filter(*out + *(long *)((long)local_178 + lVar9 * 2),puVar8,uVar7,uVar6,
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
          free(puVar8);
        }
        else {
          uVar7 = filter(*out + *(long *)((long)local_178 + lVar9 * 2),
                         (uchar *)(*(long *)((long)local_1b8 + lVar9 * 2) + (long)__ptr),
                         *(uint *)((long)local_218 + lVar9),*(uint *)((long)local_238 + lVar9),
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
        }
        if ((uVar7 != 0) || (bVar19 = lVar9 == 0x18, lVar9 = lVar9 + 4, bVar19)) break;
      } while( true );
    }
    free(__ptr);
    uVar6 = extraout_EAX;
  }
  return uVar6;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings)
{
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= posible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0)
  {
    *outsize = h + (h * ((w * bpp + 7) / 8)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error)
    {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
      {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7) / 8));
        if(!padded) error = 83; /*alloc fail*/
        if(!error)
        {
          addPaddingBits(padded, in, ((w * bpp + 7) / 8) * 8, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      }
      else
      {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error)
    {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i)
      {
        if(bpp < 8)
        {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7) / 8) * 8, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        }
        else
        {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}